

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_audio.h
# Opt level: O0

void saudio_shutdown(void)

{
  if (_saudio.valid) {
    _saudio_backend_shutdown();
    _saudio_fifo_shutdown(&_saudio.fifo);
    _saudio.valid = false;
  }
  return;
}

Assistant:

SOKOL_API_IMPL void saudio_shutdown(void) {
    if (_saudio.valid) {
        _saudio_backend_shutdown();
        _saudio_fifo_shutdown(&_saudio.fifo);
        _saudio.valid = false;
    }
}